

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

void x9_62_free_context(st_x9_62_keyex_context_t *ctx)

{
  free((ctx->pubkey).base);
  if ((EC_KEY *)ctx->privkey != (EC_KEY *)0x0) {
    EC_KEY_free((EC_KEY *)ctx->privkey);
  }
  if ((EC_GROUP *)ctx->group != (EC_GROUP *)0x0) {
    EC_GROUP_free((EC_GROUP *)ctx->group);
  }
  if ((BN_CTX *)ctx->bn_ctx != (BN_CTX *)0x0) {
    BN_CTX_free((BN_CTX *)ctx->bn_ctx);
  }
  free(ctx);
  return;
}

Assistant:

static void x9_62_free_context(struct st_x9_62_keyex_context_t *ctx)
{
    free(ctx->pubkey.base);
    if (ctx->privkey != NULL)
        EC_KEY_free(ctx->privkey);
    if (ctx->group != NULL)
        EC_GROUP_free(ctx->group);
    if (ctx->bn_ctx != NULL)
        BN_CTX_free(ctx->bn_ctx);
    free(ctx);
}